

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseEither(WastParser *this,ConstVector *alternatives)

{
  Result RVar1;
  Enum EVar2;
  
  MatchLpar(this,Either);
  EVar2 = Error;
  RVar1 = ParseConstList(this,alternatives,Expectation);
  if (RVar1.enum_ != Error) {
    RVar1 = Expect(this,Rpar);
    EVar2 = (Enum)(RVar1.enum_ == Error);
  }
  return (Result)EVar2;
}

Assistant:

Result WastParser::ParseEither(ConstVector* alternatives) {
  WABT_TRACE(ParseEither);
  MatchLpar(TokenType::Either);
  CHECK_RESULT(ParseConstList(alternatives, ConstType::Expectation));
  EXPECT(Rpar);
  return Result::Ok;
}